

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void duckdb::Printer::DefaultLinePrint(OutputStream stream,string *str)

{
  undefined7 in_register_00000039;
  undefined8 *puVar1;
  char *local_38 [2];
  char local_28 [16];
  
  if ((int)CONCAT71(in_register_00000039,stream) == 2) {
    puVar1 = (undefined8 *)&stderr;
  }
  else {
    puVar1 = (undefined8 *)&stdout;
  }
  fputs((str->_M_dataplus)._M_p,(FILE *)*puVar1);
  local_38[0] = local_28;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,anon_var_dwarf_4ed1874 + 8,anon_var_dwarf_4ed1874 + 9);
  fputs(local_38[0],(FILE *)*puVar1);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void Printer::RawPrint(OutputStream stream, const string &str) {
#ifndef DUCKDB_DISABLE_PRINT
#ifdef DUCKDB_WINDOWS
	if (IsTerminal(stream)) {
		// print utf8 to terminal
		auto unicode = WindowsUtil::UTF8ToMBCS(str.c_str());
		fprintf(stream == OutputStream::STREAM_STDERR ? stderr : stdout, "%s", unicode.c_str());
		return;
	}
#endif
	fprintf(stream == OutputStream::STREAM_STDERR ? stderr : stdout, "%s", str.c_str());
#endif
}